

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MainWindow.cpp
# Opt level: O3

void __thiscall MainWindow::OpenImagePreviewWindow(MainWindow *this,QImage *toPreview)

{
  QScrollArea *this_00;
  QPixmap *pQVar1;
  QPixmap aQStack_38 [24];
  
  this_00 = (QScrollArea *)operator_new(0x28);
  QScrollArea::QScrollArea(this_00,(QWidget *)0x0);
  pQVar1 = (QPixmap *)operator_new(0x28);
  QLabel::QLabel((QLabel *)pQVar1,0,0);
  QPixmap::fromImage(aQStack_38,toPreview,0);
  QLabel::setPixmap(pQVar1);
  QPixmap::~QPixmap(aQStack_38);
  QScrollArea::setWidget((QWidget *)this_00);
  QWidget::showMaximized();
  return;
}

Assistant:

void MainWindow::OpenImagePreviewWindow(const QImage& toPreview)
{
    QScrollArea* previewArea = new QScrollArea(nullptr);
    QLabel* previewImage = new QLabel();
    previewImage->setPixmap(QPixmap::fromImage(toPreview));
    previewArea->setWidget(previewImage);
    previewArea->showMaximized();
}